

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

int read_attribute(coda_cdf_product *product_file,int64_t offset,int32_t data_type,int32_t num_elems
                  ,coda_dynamic_type **attribute)

{
  int iVar1;
  coda_type_array *type;
  coda_mem_array *type_00;
  int local_5c;
  int i;
  coda_mem_array *array;
  coda_type_array *array_definition;
  coda_type_number *pcStack_40;
  int32_t byte_size;
  coda_type *definition;
  coda_native_type native_type;
  coda_type_class type_class;
  coda_dynamic_type **attribute_local;
  int32_t num_elems_local;
  int32_t data_type_local;
  int64_t offset_local;
  coda_cdf_product *product_file_local;
  
  switch(data_type) {
  case 1:
  case 0x29:
    definition._4_4_ = coda_integer_class;
    definition._0_4_ = coda_native_type_int8;
    array_definition._4_4_ = 1;
    break;
  case 2:
    definition._4_4_ = coda_integer_class;
    definition._0_4_ = coda_native_type_int16;
    array_definition._4_4_ = 2;
    break;
  default:
    coda_set_error(-100,"invalid CDF data type (%d)",(ulong)(uint)data_type);
    return -1;
  case 4:
    definition._4_4_ = coda_integer_class;
    definition._0_4_ = coda_native_type_int32;
    array_definition._4_4_ = 4;
    break;
  case 8:
  case 0x21:
    definition._4_4_ = coda_integer_class;
    definition._0_4_ = coda_native_type_int64;
    array_definition._4_4_ = 8;
    break;
  case 0xb:
    definition._4_4_ = coda_integer_class;
    definition._0_4_ = coda_native_type_uint8;
    array_definition._4_4_ = 1;
    break;
  case 0xc:
    definition._4_4_ = coda_integer_class;
    definition._0_4_ = coda_native_type_uint16;
    array_definition._4_4_ = 2;
    break;
  case 0xe:
    definition._4_4_ = coda_integer_class;
    definition._0_4_ = coda_native_type_uint32;
    array_definition._4_4_ = 4;
    break;
  case 0x15:
  case 0x2c:
    definition._4_4_ = coda_real_class;
    definition._0_4_ = coda_native_type_float;
    array_definition._4_4_ = 4;
    break;
  case 0x16:
  case 0x1f:
  case 0x2d:
    definition._4_4_ = coda_real_class;
    definition._0_4_ = coda_native_type_double;
    array_definition._4_4_ = 8;
    break;
  case 0x33:
  case 0x34:
    definition._4_4_ = coda_text_class;
    definition._0_4_ = coda_native_type_string;
    array_definition._4_4_ = num_elems;
  }
  if (definition._4_4_ - coda_integer_class < 2) {
    pcStack_40 = coda_type_number_new(coda_format_cdf,definition._4_4_);
  }
  else {
    if (definition._4_4_ != coda_text_class) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                    ,0x10a,
                    "int read_attribute(coda_cdf_product *, int64_t, int32_t, int32_t, coda_dynamic_type **)"
                   );
    }
    pcStack_40 = (coda_type_number *)coda_type_text_new(coda_format_cdf);
  }
  if (pcStack_40 == (coda_type_number *)0x0) {
    product_file_local._4_4_ = -1;
  }
  else {
    iVar1 = coda_type_set_read_type((coda_type *)pcStack_40,(coda_native_type)definition);
    if (iVar1 == 0) {
      if (definition._4_4_ != coda_text_class) {
        iVar1 = coda_type_set_byte_size((coda_type *)pcStack_40,(long)array_definition._4_4_);
        if (iVar1 != 0) {
          coda_type_release((coda_type *)pcStack_40);
          return -1;
        }
        iVar1 = coda_type_number_set_endianness(pcStack_40,coda_little_endian);
        if (iVar1 != 0) {
          coda_type_release((coda_type *)pcStack_40);
          return -1;
        }
      }
      if (((num_elems == 1) || (data_type == 0x33)) || (data_type == 0x34)) {
        iVar1 = read_attribute_sub(product_file,offset,array_definition._4_4_,
                                   (coda_type *)pcStack_40,attribute);
        if (iVar1 != 0) {
          coda_type_release((coda_type *)pcStack_40);
          return -1;
        }
        coda_type_release((coda_type *)pcStack_40);
      }
      else {
        type = coda_type_array_new(coda_format_cdf);
        if (type == (coda_type_array *)0x0) {
          coda_type_release((coda_type *)pcStack_40);
          return -1;
        }
        iVar1 = coda_type_array_set_base_type(type,(coda_type *)pcStack_40);
        if (iVar1 != 0) {
          coda_type_release((coda_type *)type);
          coda_type_release((coda_type *)pcStack_40);
          return -1;
        }
        coda_type_release((coda_type *)pcStack_40);
        iVar1 = coda_type_array_add_variable_dimension(type,(coda_expression *)0x0);
        if (iVar1 != 0) {
          coda_type_release((coda_type *)type);
          return -1;
        }
        type_00 = coda_mem_array_new(type,(coda_dynamic_type *)0x0);
        if (type_00 == (coda_mem_array *)0x0) {
          coda_type_release((coda_type *)type);
          return -1;
        }
        coda_type_release((coda_type *)type);
        for (local_5c = 0; local_5c < num_elems; local_5c = local_5c + 1) {
          iVar1 = read_attribute_sub(product_file,offset + local_5c * array_definition._4_4_,
                                     array_definition._4_4_,(coda_type *)pcStack_40,attribute);
          if (iVar1 != 0) {
            coda_dynamic_type_delete((coda_dynamic_type *)type_00);
            return -1;
          }
          iVar1 = coda_mem_array_add_element(type_00,*attribute);
          if (iVar1 != 0) {
            coda_dynamic_type_delete((coda_dynamic_type *)type_00);
            coda_dynamic_type_delete(*attribute);
            return -1;
          }
        }
      }
      product_file_local._4_4_ = 0;
    }
    else {
      coda_type_release((coda_type *)pcStack_40);
      product_file_local._4_4_ = -1;
    }
  }
  return product_file_local._4_4_;
}

Assistant:

static int read_attribute(coda_cdf_product *product_file, int64_t offset, int32_t data_type,
                          int32_t num_elems, coda_dynamic_type **attribute)
{
    coda_type_class type_class;
    coda_native_type native_type;
    coda_type *definition;
    int32_t byte_size;

    switch (data_type)
    {
        case 1:        /* INT1 */
        case 41:       /* BYTE */
            type_class = coda_integer_class;
            native_type = coda_native_type_int8;
            byte_size = 1;
            break;
        case 2:        /* INT2 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int16;
            byte_size = 2;
            break;
        case 4:        /* INT4 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int32;
            byte_size = 4;
            break;
        case 8:        /* INT8 */
        case 33:       /* CDF_TIME_TT2000 */
            type_class = coda_integer_class;
            native_type = coda_native_type_int64;
            byte_size = 8;
            break;
        case 11:       /* UINT1 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint8;
            byte_size = 1;
            break;
        case 12:       /* UINT2 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint16;
            byte_size = 2;
            break;
        case 14:       /* UINT4 */
            type_class = coda_integer_class;
            native_type = coda_native_type_uint32;
            byte_size = 4;
            break;
        case 21:       /* REAL4 */
        case 44:       /* FLOAT */
            type_class = coda_real_class;
            native_type = coda_native_type_float;
            byte_size = 4;
            break;
        case 22:       /* REAL8 */
        case 31:       /* CDF_EPOCH */
        case 45:       /* DOUBLE */
            type_class = coda_real_class;
            native_type = coda_native_type_double;
            byte_size = 8;
            break;
        case 51:       /* CHAR */
        case 52:       /* UCHAR */
            type_class = coda_text_class;
            native_type = coda_native_type_string;
            byte_size = num_elems;
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid CDF data type (%d)", data_type);
            return -1;
    }
    switch (type_class)
    {
        case coda_integer_class:
        case coda_real_class:
            definition = (coda_type *)coda_type_number_new(coda_format_cdf, type_class);
            break;
        case coda_text_class:
            definition = (coda_type *)coda_type_text_new(coda_format_cdf);
            break;
        default:
            assert(0);
            exit(1);
    }
    if (definition == NULL)
    {
        return -1;
    }
    if (coda_type_set_read_type(definition, native_type) != 0)
    {
        coda_type_release(definition);
        return -1;
    }
    if (type_class != coda_text_class)
    {
        if (coda_type_set_byte_size(definition, byte_size) != 0)
        {
            coda_type_release(definition);
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        if (coda_type_number_set_endianness((coda_type_number *)definition, coda_little_endian) != 0)
        {
            coda_type_release(definition);
            return -1;
        }
#endif
    }

    if (num_elems != 1 && data_type != 51 && data_type != 52)
    {
        coda_type_array *array_definition;
        coda_mem_array *array = NULL;
        int i;

        /* create an array */
        array_definition = coda_type_array_new(coda_format_cdf);
        if (array_definition == NULL)
        {
            coda_type_release(definition);
            return -1;
        }
        if (coda_type_array_set_base_type(array_definition, definition) != 0)
        {
            coda_type_release((coda_type *)array_definition);
            coda_type_release(definition);
            return -1;
        }
        coda_type_release(definition);
        if (coda_type_array_add_variable_dimension(array_definition, NULL) != 0)
        {
            coda_type_release((coda_type *)array_definition);
            return -1;
        }
        array = coda_mem_array_new(array_definition, NULL);
        if (array == NULL)
        {
            coda_type_release((coda_type *)array_definition);
            return -1;
        }
        coda_type_release((coda_type *)array_definition);
        for (i = 0; i < num_elems; i++)
        {
            if (read_attribute_sub(product_file, offset + i * byte_size, byte_size, definition, attribute) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                return -1;
            }
            if (coda_mem_array_add_element(array, *attribute) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                coda_dynamic_type_delete(*attribute);
                return -1;
            }
        }
    }
    else
    {
        if (read_attribute_sub(product_file, offset, byte_size, definition, attribute) != 0)
        {
            coda_type_release(definition);
            return -1;
        }
        coda_type_release(definition);
    }

    return 0;
}